

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall
testing::internal::MaxBipartiteMatchState::TryAugment
          (MaxBipartiteMatchState *this,size_t ilhs,vector<char,_std::allocator<char>_> *seen)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  pointer puVar4;
  size_t irhs;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    uVar1 = *(ulong *)(this->graph_ + 8);
    if (uVar1 <= uVar5) {
LAB_00111694:
      return uVar5 < uVar1;
    }
    pcVar2 = (seen->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((pcVar2[uVar5] == '\0') &&
       (*(char *)(uVar5 + uVar1 * ilhs + *(long *)(this->graph_ + 0x10)) == '\x01')) {
      pcVar2[uVar5] = '\x01';
      puVar4 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar4[uVar5] != 0xffffffffffffffff) {
        bVar3 = TryAugment(this,puVar4[uVar5],seen);
        if (!bVar3) goto LAB_0011167f;
        puVar4 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[ilhs] = uVar5;
      puVar4[uVar5] = ilhs;
      goto LAB_00111694;
    }
LAB_0011167f:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool TryAugment(size_t ilhs, ::std::vector<char>* seen) {
    for (size_t irhs = 0; irhs < graph_->RhsSize(); ++irhs) {
      if ((*seen)[irhs]) continue;
      if (!graph_->HasEdge(ilhs, irhs)) continue;
      // There's an available edge from ilhs to irhs.
      (*seen)[irhs] = 1;
      // Next a search is performed to determine whether
      // this edge is a dead end or leads to the sink.
      //
      // right_[irhs] == kUnused means that there is residual flow from
      // right node irhs to the sink, so we can use that to finish this
      // flow path and return success.
      //
      // Otherwise there is residual flow to some ilhs. We push flow
      // along that path and call ourselves recursively to see if this
      // ultimately leads to sink.
      if (right_[irhs] == kUnused || TryAugment(right_[irhs], seen)) {
        // Add flow from left_[ilhs] to right_[irhs].
        left_[ilhs] = irhs;
        right_[irhs] = ilhs;
        return true;
      }
    }
    return false;
  }